

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Entry * __thiscall
kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::insert
          (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *this,uint key,
          Own<capnp::_::SegmentReader> *value)

{
  uint *puVar1;
  Own<capnp::_::SegmentReader> *other;
  Entry *pEVar2;
  Entry local_38;
  Own<capnp::_::SegmentReader> *local_20;
  Own<capnp::_::SegmentReader> *value_local;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *pHStack_10;
  uint key_local;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *this_local;
  
  local_20 = value;
  value_local._4_4_ = key;
  pHStack_10 = this;
  puVar1 = mv<unsigned_int>((uint *)((long)&value_local + 4));
  local_38.key = *puVar1;
  other = mv<kj::Own<capnp::_::SegmentReader>>(value);
  Own<capnp::_::SegmentReader>::Own(&local_38.value,other);
  pEVar2 = Table<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks>_>
           ::insert(&this->table,&local_38);
  Entry::~Entry(&local_38);
  return pEVar2;
}

Assistant:

typename HashMap<Key, Value>::Entry& HashMap<Key, Value>::insert(Key key, Value value) {
  return table.insert(Entry { kj::mv(key), kj::mv(value) });
}